

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

bool __thiscall
chaiscript::dispatch::Dynamic_Proxy_Function::operator==
          (Dynamic_Proxy_Function *this,Proxy_Function_Base *rhs)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast(rhs,&Proxy_Function_Base::typeinfo,&typeinfo);
  if (this == (Dynamic_Proxy_Function *)rhs) {
    bVar1 = true;
  }
  else {
    if (lVar2 != 0) {
      if ((this->super_Proxy_Function_Base).m_arity != *(int *)(lVar2 + 0x20)) {
        return false;
      }
      if ((this->m_guard).
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        return false;
      }
      if (*(long *)(lVar2 + 0x60) == 0) {
        bVar1 = std::operator==(&(this->m_param_types).m_types,
                                (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                                 *)(lVar2 + 0x28));
        return bVar1;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

virtual bool operator==(const Proxy_Function_Base &rhs) const CHAISCRIPT_OVERRIDE
        {
          const Dynamic_Proxy_Function *prhs = dynamic_cast<const Dynamic_Proxy_Function *>(&rhs);

          return this == &rhs
            || (prhs
                && this->m_arity == prhs->m_arity
                && !this->m_guard && !prhs->m_guard
                && this->m_param_types == prhs->m_param_types);
        }